

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabUnlockList(sqlite3 *db)

{
  VTable *pVVar1;
  Vdbe *pVVar2;
  VTable *pVTab;
  
  pVTab = db->pDisconnect;
  if (pVTab != (VTable *)0x0) {
    db->pDisconnect = (VTable *)0x0;
    for (pVVar2 = db->pVdbe; pVVar2 != (Vdbe *)0x0; pVVar2 = pVVar2->pVNext) {
      pVVar2->field_0xc6 = (pVVar2->field_0xc6 & 0xfc) + 1;
    }
    do {
      pVVar1 = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      pVTab = pVVar1;
    } while (pVVar1 != (VTable *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlockList(sqlite3 *db){
  VTable *p = db->pDisconnect;

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  if( p ){
    db->pDisconnect = 0;
    sqlite3ExpirePreparedStatements(db, 0);
    do {
      VTable *pNext = p->pNext;
      sqlite3VtabUnlock(p);
      p = pNext;
    }while( p );
  }
}